

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushID(char *str_id)

{
  int *piVar1;
  ImGuiWindow *this;
  ImGuiID IVar2;
  int iVar3;
  uint *__dest;
  ImGuiContext *pIVar4;
  int iVar5;
  uint *puVar6;
  int iVar7;
  
  this = GImGui->CurrentWindow;
  this->Accessed = true;
  IVar2 = ImGuiWindow::GetID(this,str_id,(char *)0x0);
  pIVar4 = GImGui;
  iVar3 = (this->IDStack).Size;
  if (iVar3 != (this->IDStack).Capacity) {
    __dest = (this->IDStack).Data;
    goto LAB_0013e2af;
  }
  if (iVar3 == 0) {
    iVar5 = 8;
  }
  else {
    iVar5 = iVar3 / 2 + iVar3;
  }
  iVar7 = iVar3 + 1;
  if (iVar3 + 1 < iVar5) {
    iVar7 = iVar5;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (uint *)(*(pIVar4->IO).MemAllocFn)((long)iVar7 << 2);
  puVar6 = (this->IDStack).Data;
  if (puVar6 == (uint *)0x0) {
LAB_0013e293:
    puVar6 = (uint *)0x0;
    pIVar4 = GImGui;
  }
  else {
    memcpy(__dest,puVar6,(long)(this->IDStack).Size << 2);
    pIVar4 = GImGui;
    puVar6 = (this->IDStack).Data;
    if (puVar6 == (uint *)0x0) goto LAB_0013e293;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar4->IO).MemFreeFn)(puVar6);
  (this->IDStack).Data = __dest;
  (this->IDStack).Capacity = iVar7;
  iVar3 = (this->IDStack).Size;
LAB_0013e2af:
  (this->IDStack).Size = iVar3 + 1;
  __dest[iVar3] = IVar2;
  return;
}

Assistant:

void ImGui::PushID(const char* str_id)
{
    ImGuiWindow* window = GetCurrentWindow();
    window->IDStack.push_back(window->GetID(str_id));
}